

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm_ssse3.c
# Opt level: O2

void idct32_low1_ssse3(__m128i *input,__m128i *output)

{
  undefined1 auVar1 [16];
  __m128i alVar2;
  
  auVar1 = pshuflw(ZEXT416((uint)0xb50),ZEXT416((uint)0xb50),0);
  auVar1._4_4_ = auVar1._0_4_;
  auVar1._8_4_ = auVar1._0_4_;
  auVar1._12_4_ = auVar1._0_4_;
  auVar1 = psllw(auVar1,3);
  alVar2 = (__m128i)pmulhrsw(auVar1,(undefined1  [16])*input);
  *output = alVar2;
  output[0x1f] = alVar2;
  output[1] = alVar2;
  output[0x1e] = alVar2;
  output[2] = alVar2;
  output[0x1d] = alVar2;
  output[3] = alVar2;
  output[0x1c] = alVar2;
  output[4] = alVar2;
  output[0x1b] = alVar2;
  output[5] = alVar2;
  output[0x1a] = alVar2;
  output[6] = alVar2;
  output[0x19] = alVar2;
  output[7] = alVar2;
  output[0x18] = alVar2;
  output[8] = alVar2;
  output[0x17] = alVar2;
  output[9] = alVar2;
  output[0x16] = alVar2;
  output[10] = alVar2;
  output[0x15] = alVar2;
  output[0xb] = alVar2;
  output[0x14] = alVar2;
  output[0xc] = alVar2;
  output[0x13] = alVar2;
  output[0xd] = alVar2;
  output[0x12] = alVar2;
  output[0xe] = alVar2;
  output[0x11] = alVar2;
  output[0xf] = alVar2;
  output[0x10] = alVar2;
  return;
}

Assistant:

static void idct32_low1_ssse3(const __m128i *input, __m128i *output) {
  const int32_t *cospi = cospi_arr(INV_COS_BIT);

  // stage 1
  __m128i x[2];
  x[0] = input[0];

  // stage 2
  // stage 3
  // stage 4
  // stage 5
  btf_16_ssse3(cospi[32], cospi[32], x[0], x[0], x[1]);

  // stage 6
  // stage 7
  // stage 8
  // stage 9
  output[0] = x[0];
  output[31] = x[0];
  output[1] = x[1];
  output[30] = x[1];
  output[2] = x[1];
  output[29] = x[1];
  output[3] = x[0];
  output[28] = x[0];
  output[4] = x[0];
  output[27] = x[0];
  output[5] = x[1];
  output[26] = x[1];
  output[6] = x[1];
  output[25] = x[1];
  output[7] = x[0];
  output[24] = x[0];
  output[8] = x[0];
  output[23] = x[0];
  output[9] = x[1];
  output[22] = x[1];
  output[10] = x[1];
  output[21] = x[1];
  output[11] = x[0];
  output[20] = x[0];
  output[12] = x[0];
  output[19] = x[0];
  output[13] = x[1];
  output[18] = x[1];
  output[14] = x[1];
  output[17] = x[1];
  output[15] = x[0];
  output[16] = x[0];
}